

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Delaunay3dThread::show_tet(Delaunay3dThread *this,index_t t)

{
  bool bVar1;
  signed_index_t sVar2;
  index_t lv;
  ostream *poVar3;
  char local_1d;
  uint local_1c;
  uint local_18;
  index_t v;
  index_t f;
  index_t t_local;
  Delaunay3dThread *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"tet");
  bVar1 = tet_is_in_list(this,t);
  local_1d = '*';
  if (!bVar1) {
    local_1d = ' ';
  }
  poVar3 = std::operator<<(poVar3,local_1d);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t);
  poVar3 = std::operator<<(poVar3,", v=[");
  sVar2 = tet_vertex(this,t,0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  poVar3 = std::operator<<(poVar3,' ');
  sVar2 = tet_vertex(this,t,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  poVar3 = std::operator<<(poVar3,' ');
  sVar2 = tet_vertex(this,t,2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  poVar3 = std::operator<<(poVar3,' ');
  sVar2 = tet_vertex(this,t,3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  std::operator<<(poVar3,"]  adj=[");
  show_tet_adjacent(this,t,0);
  show_tet_adjacent(this,t,1);
  show_tet_adjacent(this,t,2);
  show_tet_adjacent(this,t,3);
  std::operator<<((ostream *)&std::cerr,"] ");
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,'f');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    std::operator<<(poVar3,':');
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      lv = tet_facet_vertex(local_18,local_1c);
      sVar2 = tet_vertex(this,t,lv);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,sVar2);
      std::operator<<(poVar3,',');
    }
    std::operator<<((ostream *)&std::cerr,' ');
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void show_tet(index_t t) const {
            std::cerr << "tet"
                      << (tet_is_in_list(t) ? '*' : ' ')
                      << t
                      << ", v=["
                      << tet_vertex(t, 0)
                      << ' '
                      << tet_vertex(t, 1)
                      << ' '
                      << tet_vertex(t, 2)
                      << ' '
                      << tet_vertex(t, 3)
                      << "]  adj=[";
            show_tet_adjacent(t, 0);
            show_tet_adjacent(t, 1);
            show_tet_adjacent(t, 2);
            show_tet_adjacent(t, 3);
            std::cerr << "] ";
            
            for(index_t f = 0; f < 4; ++f) {
                std::cerr << 'f' << f << ':';
                for(index_t v = 0; v < 3; ++v) {
                    std::cerr << tet_vertex(t, tet_facet_vertex(f,v))
                              << ',';
                }
                std::cerr << ' ';
            }
            std::cerr << std::endl;
        }